

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive8.cpp
# Opt level: O3

size_t __thiscall embree::CurveNv<8>::Type::sizeActive(Type *this,char *This)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [32];
  
  if ((*This & 0x1cU) == 0) {
    auVar2 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar3 = vpcmpeqd_avx(auVar2,*(undefined1 (*) [16])(This + 0x40));
    auVar2 = vpcmpeqd_avx(auVar2,*(undefined1 (*) [16])(This + 0x50));
    auVar5._16_16_ = auVar2;
    auVar5._0_16_ = auVar3;
    auVar5 = vcvtdq2ps_avx(auVar5);
    auVar6._8_4_ = 0xbf800000;
    auVar6._0_8_ = 0xbf800000bf800000;
    auVar6._12_4_ = 0xbf800000;
    auVar6._16_4_ = 0xbf800000;
    auVar6._20_4_ = 0xbf800000;
    auVar6._24_4_ = 0xbf800000;
    auVar6._28_4_ = 0xbf800000;
    auVar5 = vcmpps_avx(auVar6,auVar5,1);
    uVar4 = vmovmskps_avx(auVar5);
    uVar1 = 0;
    if (~uVar4 != 0) {
      for (; (~uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    return (ulong)uVar1;
  }
  return (ulong)(byte)This[1];
}

Assistant:

size_t Curve8v::Type::sizeActive(const char* This) const
  {
    if ((*This & Geometry::GType::GTY_BASIS_MASK) == Geometry::GType::GTY_BASIS_LINEAR)
      return ((Line8i*)This)->size();
    else
      return ((Curve8v*)This)->N;
  }